

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckedint_impl.h
# Opt level: O1

void QRect_unite(QRect *rect,QRect *other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Representation RVar6;
  Representation RVar7;
  Representation RVar8;
  
  iVar1 = (rect->x1).m_i;
  iVar2 = (rect->y1).m_i;
  iVar3 = (rect->x2).m_i;
  iVar4 = (rect->y2).m_i;
  if (iVar4 < iVar2 || iVar3 < iVar1) {
    RVar6.m_i = (other->y1).m_i;
    RVar7.m_i = (other->x2).m_i;
    RVar8.m_i = (other->y2).m_i;
    rect->x1 = (Representation)(other->x1).m_i;
    rect->y1 = (Representation)RVar6.m_i;
    rect->x2 = (Representation)RVar7.m_i;
    rect->y2 = (Representation)RVar8.m_i;
    return;
  }
  iVar5 = (other->x1).m_i;
  if (iVar1 < iVar5) {
    iVar5 = iVar1;
  }
  iVar1 = (other->y1).m_i;
  if (iVar2 < iVar1) {
    iVar1 = iVar2;
  }
  iVar2 = (other->x2).m_i;
  if (iVar2 < iVar3) {
    iVar2 = iVar3;
  }
  iVar3 = (other->y2).m_i;
  if (iVar3 < iVar4) {
    iVar3 = iVar4;
  }
  (rect->x1).m_i = iVar5;
  (rect->y1).m_i = iVar1;
  (rect->x2).m_i = iVar2;
  (rect->y2).m_i = iVar3;
  return;
}

Assistant:

Q_DECLARE_STRONGLY_ORDERED_LITERAL_TYPE(
        QCheckedInt,
        AInt,
        template <typename AInt, if_is_same_int<AInt> = true>)
};

template <typename Int, typename I, typename P>
Q_DECL_CONST_FUNCTION size_t constexpr inline qHash(QCheckedInt<Int, I, P> key, size_t seed = 0) noexcept
{
    using QT_PREPEND_NAMESPACE(qHash);
    return qHash(key.value(), seed);
}